

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::IsOff(char *val)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  char *unaff_retaddr;
  char *pcStack_8;
  
  if (val == (char *)0x0) {
    return true;
  }
  bVar1 = *val;
  if (0x65 < bVar1) {
    switch(bVar1) {
    case 0x66:
      goto switchD_001f3049_caseD_0;
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
      goto switchD_001f3049_caseD_1;
    case 0x69:
      goto switchD_001f3049_caseD_3;
    case 0x6e:
      goto switchD_001f3049_caseD_8;
    case 0x6f:
      goto switchD_001f3049_caseD_9;
    default:
      goto code_r0x001f2ff4;
    }
  }
  switch(bVar1 - 0x46) {
  case 0:
switchD_001f3049_caseD_0:
    if ((((byte)(val[1] | 0x20U) == 0x61) && ((byte)(val[2] | 0x20U) == 0x6c)) &&
       (((byte)(val[3] | 0x20U) == 0x73 && (((byte)(val[4] | 0x20U) == 0x65 && (val[5] == '\0'))))))
    {
      return true;
    }
    if ((bVar1 | 0x20) != 0x69) goto code_r0x001f2ff4;
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 6:
  case 7:
    goto switchD_001f3049_caseD_1;
  case 3:
    break;
  case 8:
switchD_001f3049_caseD_8:
    cVar2 = val[1];
    if (cVar2 == '\0') {
      return true;
    }
    if (((cVar2 == 'o') || (cVar2 == 'O')) && (val[2] == '\0')) {
      return true;
    }
    if (bVar1 < 0x66) {
      if (bVar1 == 0x46) goto switchD_001f3049_caseD_0;
      if (bVar1 != 0x49) {
switchD_001f3049_caseD_1:
        bVar3 = IsNOTFOUND(unaff_retaddr);
        return bVar3;
      }
    }
    else if (bVar1 != 0x69) {
      if (bVar1 != 0x66) goto code_r0x001f2ff4;
      goto switchD_001f3049_caseD_0;
    }
    break;
  case 9:
switchD_001f3049_caseD_9:
    if ((((byte)(val[1] | 0x20U) == 0x66) && ((byte)(val[2] | 0x20U) == 0x66)) && (val[3] == '\0'))
    {
      return true;
    }
    uVar5 = (ulong)(bVar1 - 0x46);
    if (0x28 < bVar1 - 0x46) goto code_r0x001f2ff4;
    if ((0x100000001U >> (uVar5 & 0x3f) & 1) != 0) goto switchD_001f3049_caseD_0;
    if ((0x800000008U >> (uVar5 & 0x3f) & 1) == 0) {
      if ((0x10000000100U >> (uVar5 & 0x3f) & 1) == 0) goto code_r0x001f2ff4;
      goto switchD_001f3049_caseD_8;
    }
    break;
  default:
    if (bVar1 == 0) {
      return true;
    }
    if (bVar1 != 0x30) goto code_r0x001f2ff4;
    if (val[1] == '\0') {
      return true;
    }
    switch(bVar1 - 0x46) {
    case 0:
      goto switchD_001f3049_caseD_0;
    case 1:
    case 2:
    case 4:
    case 5:
    case 6:
    case 7:
      goto switchD_001f3049_caseD_1;
    case 3:
      break;
    case 8:
      goto switchD_001f3049_caseD_8;
    case 9:
      goto switchD_001f3049_caseD_9;
    default:
      goto code_r0x001f2ff4;
    }
  }
switchD_001f3049_caseD_3:
  if ((((((byte)(val[1] | 0x20U) == 0x67) && ((byte)(val[2] | 0x20U) == 0x6e)) &&
       ((byte)(val[3] | 0x20U) == 0x6f)) &&
      (((byte)(val[4] | 0x20U) == 0x72 && ((byte)(val[5] | 0x20U) == 0x65)))) && (val[6] == '\0')) {
    return true;
  }
code_r0x001f2ff4:
  pcStack_8 = val;
  iVar4 = strcmp(val,"NOTFOUND");
  if (iVar4 == 0) {
    bVar3 = true;
  }
  else {
    bVar3 = cmHasLiteralSuffix<char_const*,10ul>(&pcStack_8,(char (*) [10])0x49246e);
  }
  return bVar3;
}

Assistant:

bool cmSystemTools::IsOff(const char* val)
{
  // ""
  if (!val || val[0] == '\0') {
    return true;
  }
  /* clang-format off */
  // "0"
  if (val[0] == '0' && val[1] == '\0') {
    return true;
  }
  // "OFF"
  if ((val[0] == 'O' || val[0] == 'o') &&
      (val[1] == 'F' || val[1] == 'f') &&
      (val[2] == 'F' || val[2] == 'f') && val[3] == '\0') {
    return true;
  }
  // "N", "NO"
  if ((val[0] == 'N' || val[0] == 'n') && (val[1] == '\0' || (
      (val[1] == 'O' || val[1] == 'o') && val[2] == '\0'))) {
    return true;
  }
  // "FALSE"
  if ((val[0] == 'F' || val[0] == 'f') &&
      (val[1] == 'A' || val[1] == 'a') &&
      (val[2] == 'L' || val[2] == 'l') &&
      (val[3] == 'S' || val[3] == 's') &&
      (val[4] == 'E' || val[4] == 'e') && val[5] == '\0') {
    return true;
  }
  // "IGNORE"
  if ((val[0] == 'I' || val[0] == 'i') &&
      (val[1] == 'G' || val[1] == 'g') &&
      (val[2] == 'N' || val[2] == 'n') &&
      (val[3] == 'O' || val[3] == 'o') &&
      (val[4] == 'R' || val[4] == 'r') &&
      (val[5] == 'E' || val[5] == 'e') && val[6] == '\0') {
    return true;
  }
  /* clang-format on */
  return cmSystemTools::IsNOTFOUND(val);
}